

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_error_estimator.cpp
# Opt level: O3

float __thiscall ltc_error_estimator::estimate_error(ltc_error_estimator *this,vec3 parameters)

{
  int i;
  int iVar1;
  int iVar2;
  double dVar3;
  vec2 random_sample;
  halton_sampler2d sampler2d;
  ltc ltc;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_e8;
  double local_d8;
  double local_d0;
  anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::precision)0>_3 local_c8;
  undefined **local_c0;
  uint32_t local_b8;
  ltc local_b0;
  
  local_e8.field_0.z = (float)parameters.field_0._8_4_;
  local_e8._0_8_ = parameters.field_0._0_8_;
  if (this->_force_isotropy == true) {
    local_e8.field_0.y = (float)parameters.field_0._0_4_;
    local_e8.field_0.x = (float)parameters.field_0._0_4_;
    local_e8.field_0.z = 0.0;
  }
  ::ltc::ltc(&local_b0);
  ::ltc::set_amplitude(&local_b0,this->_amplitude);
  ::ltc::set_base_frame(&local_b0,&this->_base_frame);
  ::ltc::set_ltc_parameters(&local_b0,(vec3 *)&local_e8.field_0);
  local_c0 = &PTR__sampler2d_001c9b78;
  local_b8 = 0;
  iVar1 = 0;
  local_d0 = 0.0;
  do {
    iVar2 = 0x20;
    do {
      local_c8.field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::precision)0>_3_0
            )halton_sampler2d::getNextSample((halton_sampler2d *)&local_c0);
      local_d8 = estimate_partial_error
                           (this,&local_b0.super_brdf,this->_brdf,(vec2 *)&local_c8.field_0);
      dVar3 = estimate_partial_error
                        (this,this->_brdf,&local_b0.super_brdf,(vec2 *)&local_c8.field_0);
      local_d0 = local_d0 + local_d8 + dVar3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x20);
  return (float)(local_d0 * 0.0009765625);
}

Assistant:

float ltc_error_estimator::estimate_error(glm::vec3 parameters) const
{
  const int num_samples = 32;

  if (_force_isotropy)
  {
    parameters.y = parameters.x;
    parameters.z = 0.0f;
  }

  double total_error = 0.0f;

  ltc ltc;
  ltc.set_amplitude(_amplitude);
  ltc.set_base_frame(_base_frame);
  ltc.set_ltc_parameters(parameters);

  halton_sampler2d sampler2d;
  for (auto i = 0; i < num_samples; ++i)
  {
    for (auto j = 0; j < num_samples; ++j)
    {
      const auto random_sample = sampler2d.getNextSample();

      total_error += estimate_partial_error(ltc, _brdf, random_sample);
      total_error += estimate_partial_error(_brdf, ltc, random_sample);
    }
  }

  float final_error = static_cast<float>(total_error / static_cast<double>(num_samples * num_samples));
  return final_error;
}